

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

wchar_t assertion_file_contains_lines_any_order(char *file,wchar_t line,char *pathname,char **lines)

{
  ulong uVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  long in_RCX;
  char *in_RDX;
  wchar_t in_ESI;
  char *in_RDI;
  wchar_t actual_failure;
  wchar_t expected_failure;
  char c;
  char **actual;
  char *p;
  char **expected;
  size_t j;
  size_t i;
  size_t actual_count;
  size_t expected_count;
  size_t buff_size;
  char *buff;
  int local_7c;
  int local_78;
  char local_71;
  void *local_70;
  char *local_68;
  void *local_60;
  ulong local_58;
  ulong local_50;
  size_t local_48;
  size_t local_38;
  char *local_30;
  long local_28;
  char *local_20;
  wchar_t local_14;
  char *local_10;
  wchar_t local_4;
  
  local_60 = (void *)0x0;
  local_70 = (void *)0x0;
  local_78 = 0;
  local_7c = 0;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  assertion_count(in_RDI,in_ESI);
  local_30 = slurpfile(&local_38,"%s",local_20);
  if (local_30 == (char *)0x0) {
    failure_start(local_20,(wchar_t)(ulong)(uint)local_14,"Can\'t read file: %s",local_20);
    failure_finish((void *)0x105454);
    local_4 = L'\0';
  }
  else {
    for (local_50 = 0; uVar1 = local_50, *(long *)(local_28 + local_50 * 8) != 0;
        local_50 = local_50 + 1) {
    }
    if (local_50 != 0) {
      local_60 = malloc(local_50 << 3);
      if (local_60 == (void *)0x0) {
        failure_start(local_20,(wchar_t)(ulong)(uint)local_14,"Can\'t allocate memory");
        failure_finish((void *)0x1054e1);
        free((void *)0x0);
        return L'\0';
      }
      for (local_50 = 0; *(long *)(local_28 + local_50 * 8) != 0; local_50 = local_50 + 1) {
        pcVar3 = strdup(*(char **)(local_28 + local_50 * 8));
        *(char **)((long)local_60 + local_50 * 8) = pcVar3;
      }
    }
    local_48 = 0;
    local_71 = '\0';
    for (local_68 = local_30; local_68 < local_30 + local_38; local_68 = local_68 + 1) {
      if ((*local_68 == '\r') || (*local_68 == '\n')) {
        *local_68 = '\0';
      }
      if ((local_71 == '\0') && (*local_68 != '\0')) {
        local_48 = local_48 + 1;
      }
      local_71 = *local_68;
    }
    if (local_48 != 0) {
      local_70 = calloc(8,local_48);
      if (local_70 == (void *)0x0) {
        failure_start(local_20,(wchar_t)(ulong)(uint)local_14,"Can\'t allocate memory");
        failure_finish((void *)0x105621);
        free(local_60);
        return L'\0';
      }
      local_58 = 0;
      for (local_68 = local_30; local_68 < local_30 + local_38; local_68 = local_68 + sVar4 + 1) {
        if (*local_68 != '\0') {
          *(char **)((long)local_70 + local_58 * 8) = local_68;
          local_58 = local_58 + 1;
        }
        sVar4 = strlen(local_68);
      }
    }
    for (local_50 = 0; local_50 < uVar1; local_50 = local_50 + 1) {
      if (*(long *)((long)local_60 + local_50 * 8) != 0) {
        for (local_58 = 0; local_58 < local_48; local_58 = local_58 + 1) {
          if ((*(long *)((long)local_70 + local_58 * 8) != 0) &&
             (iVar2 = strcmp(*(char **)((long)local_60 + local_50 * 8),
                             *(char **)((long)local_70 + local_58 * 8)), iVar2 == 0)) {
            free(*(void **)((long)local_60 + local_50 * 8));
            *(undefined8 *)((long)local_60 + local_50 * 8) = 0;
            *(undefined8 *)((long)local_70 + local_58 * 8) = 0;
            break;
          }
        }
      }
    }
    for (local_50 = 0; local_50 < uVar1; local_50 = local_50 + 1) {
      if (*(long *)((long)local_60 + local_50 * 8) != 0) {
        local_78 = local_78 + 1;
      }
    }
    for (local_58 = 0; local_58 < local_48; local_58 = local_58 + 1) {
      if (*(long *)((long)local_70 + local_58 * 8) != 0) {
        local_7c = local_7c + 1;
      }
    }
    if ((local_78 == 0) && (local_7c == 0)) {
      free(local_30);
      free(local_60);
      free(local_70);
      local_4 = L'\x01';
    }
    else {
      failure_start(local_10,(wchar_t)(ulong)(uint)local_14,"File doesn\'t match: %s",local_20);
      for (local_50 = 0; local_50 < uVar1; local_50 = local_50 + 1) {
        if (*(long *)((long)local_60 + local_50 * 8) != 0) {
          logprintf("  Expected but not present: %s\n",
                    *(undefined8 *)((long)local_60 + local_50 * 8));
          free(*(void **)((long)local_60 + local_50 * 8));
        }
      }
      for (local_58 = 0; local_58 < local_48; local_58 = local_58 + 1) {
        if (*(long *)((long)local_70 + local_58 * 8) != 0) {
          logprintf("  Present but not expected: %s\n",
                    *(undefined8 *)((long)local_70 + local_58 * 8));
        }
      }
      failure_finish((void *)0x105934);
      free(local_30);
      free(local_60);
      free(local_70);
      local_4 = L'\0';
    }
  }
  return local_4;
}

Assistant:

int
assertion_file_contains_lines_any_order(const char *file, int line,
    const char *pathname, const char *lines[])
{
	char *buff;
	size_t buff_size;
	size_t expected_count, actual_count, i, j;
	char **expected = NULL;
	char *p, **actual = NULL;
	char c;
	int expected_failure = 0, actual_failure = 0;

	assertion_count(file, line);

	buff = slurpfile(&buff_size, "%s", pathname);
	if (buff == NULL) {
		failure_start(pathname, line, "Can't read file: %s", pathname);
		failure_finish(NULL);
		return (0);
	}

	/* Make a copy of the provided lines and count up the expected
	 * file size. */
	for (i = 0; lines[i] != NULL; ++i) {
	}
	expected_count = i;
	if (expected_count) {
		expected = malloc(sizeof(char *) * expected_count);
		if (expected == NULL) {
			failure_start(pathname, line, "Can't allocate memory");
			failure_finish(NULL);
			free(expected);
			return (0);
		}
		for (i = 0; lines[i] != NULL; ++i) {
			expected[i] = strdup(lines[i]);
		}
	}

	/* Break the file into lines */
	actual_count = 0;
	for (c = '\0', p = buff; p < buff + buff_size; ++p) {
		if (*p == '\x0d' || *p == '\x0a')
			*p = '\0';
		if (c == '\0' && *p != '\0')
			++actual_count;
		c = *p;
	}
	if (actual_count) {
		actual = calloc(sizeof(char *), actual_count);
		if (actual == NULL) {
			failure_start(pathname, line, "Can't allocate memory");
			failure_finish(NULL);
			free(expected);
			return (0);
		}
		for (j = 0, p = buff; p < buff + buff_size; p += 1 + strlen(p)) {
			if (*p != '\0') {
				actual[j] = p;
				++j;
			}
		}
	}

	/* Erase matching lines from both lists */
	for (i = 0; i < expected_count; ++i) {
		if (expected[i] == NULL)
			continue;
		for (j = 0; j < actual_count; ++j) {
			if (actual[j] == NULL)
				continue;
			if (strcmp(expected[i], actual[j]) == 0) {
				free(expected[i]);
				expected[i] = NULL;
				actual[j] = NULL;
				break;
			}
		}
	}

	/* If there's anything left, it's a failure */
	for (i = 0; i < expected_count; ++i) {
		if (expected[i] != NULL)
			++expected_failure;
	}
	for (j = 0; j < actual_count; ++j) {
		if (actual[j] != NULL)
			++actual_failure;
	}
	if (expected_failure == 0 && actual_failure == 0) {
		free(buff);
		free(expected);
		free(actual);
		return (1);
	}
	failure_start(file, line, "File doesn't match: %s", pathname);
	for (i = 0; i < expected_count; ++i) {
		if (expected[i] != NULL) {
			logprintf("  Expected but not present: %s\n", expected[i]);
			free(expected[i]);
		}
	}
	for (j = 0; j < actual_count; ++j) {
		if (actual[j] != NULL)
			logprintf("  Present but not expected: %s\n", actual[j]);
	}
	failure_finish(NULL);
	free(buff);
	free(expected);
	free(actual);
	return (0);
}